

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testSampleImages.cpp
# Opt level: O0

void testSampleImages(string *param_1)

{
  byte bVar1;
  ostream *poVar2;
  exception *e;
  int i;
  uint in_stack_000000bc;
  char *in_stack_000000c0;
  char *in_stack_000000f8;
  char *in_stack_00000100;
  int local_18;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Testing sample image files");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  anon_unknown.dwarf_217a65::readImage(in_stack_000000c0,in_stack_000000bc);
  anon_unknown.dwarf_217a65::readImage(in_stack_000000c0,in_stack_000000bc);
  anon_unknown.dwarf_217a65::readImage(in_stack_000000c0,in_stack_000000bc);
  anon_unknown.dwarf_217a65::readImage(in_stack_000000c0,in_stack_000000bc);
  anon_unknown.dwarf_217a65::readImage(in_stack_000000c0,in_stack_000000bc);
  for (local_18 = 0; local_18 < 5; local_18 = local_18 + 1) {
    bVar1 = IlmThread_3_4::supportsThreads();
    if ((bVar1 & 1) != 0) {
      Imf_3_4::setGlobalThreadCount(local_18);
      anon_unknown.dwarf_217a65::readImage(in_stack_000000c0,in_stack_000000bc);
      anon_unknown.dwarf_217a65::readImage(in_stack_000000c0,in_stack_000000bc);
    }
  }
  anon_unknown.dwarf_217a65::compareImages(in_stack_00000100,in_stack_000000f8);
  anon_unknown.dwarf_217a65::compareImages(in_stack_00000100,in_stack_000000f8);
  anon_unknown.dwarf_217a65::compareImages(in_stack_00000100,in_stack_000000f8);
  anon_unknown.dwarf_217a65::compareImages(in_stack_00000100,in_stack_000000f8);
  anon_unknown.dwarf_217a65::compareImages(in_stack_00000100,in_stack_000000f8);
  poVar2 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void
testSampleImages (const std::string&)
{
    try
    {
        cout << "Testing sample image files" << endl;

        readImage (ILM_IMF_TEST_IMAGEDIR "comp_none.exr", 24988);
        readImage (ILM_IMF_TEST_IMAGEDIR "comp_rle.exr", 24988);
        readImage (ILM_IMF_TEST_IMAGEDIR "comp_zips.exr", 24988);
        readImage (ILM_IMF_TEST_IMAGEDIR "comp_zip.exr", 24988);
        readImage (ILM_IMF_TEST_IMAGEDIR "comp_piz.exr", 24988);

        for (int i = 0; i < 5; i++)
        {
            if (ILMTHREAD_NAMESPACE::supportsThreads ())
            {
                setGlobalThreadCount (i);

                readImage (
                    ILM_IMF_TEST_IMAGEDIR "lineOrder_increasing.exr", 46515);

                readImage (
                    ILM_IMF_TEST_IMAGEDIR "lineOrder_decreasing.exr", 46515);
            }
        }

        compareImages (
            ILM_IMF_TEST_IMAGEDIR "comp_b44.exr",
            ILM_IMF_TEST_IMAGEDIR "comp_b44_piz.exr");

        compareImages (
            ILM_IMF_TEST_IMAGEDIR "comp_dwaa_v1.exr",
            ILM_IMF_TEST_IMAGEDIR "comp_dwaa_piz.exr");
        compareImages (
            ILM_IMF_TEST_IMAGEDIR "comp_dwaa_v2.exr",
            ILM_IMF_TEST_IMAGEDIR "comp_dwaa_piz.exr");

        compareImages (
            ILM_IMF_TEST_IMAGEDIR "comp_dwab_v1.exr",
            ILM_IMF_TEST_IMAGEDIR "comp_dwab_piz.exr");
        compareImages (
            ILM_IMF_TEST_IMAGEDIR "comp_dwab_v2.exr",
            ILM_IMF_TEST_IMAGEDIR "comp_dwab_piz.exr");

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}